

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_dist.hpp
# Opt level: O3

void __thiscall
trng::discrete_dist::param_type::param_type
          (param_type *this,vector<double,_std::allocator<double>_> *P)

{
  size_type sVar1;
  pointer pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pdVar2 = (P->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (P->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
  (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar2;
  (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (P->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (P->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (P->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (P->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  uVar4 = (long)(this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  this->N_ = uVar4;
  uVar5 = 0x3f;
  if (uVar4 != 0) {
    for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  uVar3 = uVar5;
  if (uVar4 < 2) {
    uVar3 = 0;
  }
  uVar5 = (uVar5 ^ 0xffffffffffffffc0) + 0x41;
  if (uVar4 <= (ulong)(1L << ((byte)uVar3 & 0x3f))) {
    uVar5 = uVar3;
  }
  this->layers_ = uVar5;
  uVar5 = ~(-1L << ((byte)uVar5 & 0x3f));
  this->offset_ = uVar5;
  std::vector<double,_std::allocator<double>_>::resize(&this->P_,uVar5 + uVar4);
  sVar1 = this->N_;
  if (sVar1 != 0) {
    memmove((this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish + -sVar1,
            (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,sVar1 * 8);
  }
  if (this->offset_ != 0) {
    memset((this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start,0,this->offset_ << 3);
  }
  update_all_layers(this);
  return;
}

Assistant:

explicit param_type(std::vector<double> P)
          : P_(std::move(P)),
            N_{P_.size()},
            layers_{int_math::log2_ceil(N_)},
            offset_{int_math::pow2(layers_) - 1} {
        P_.resize(N_ + offset_);
        std::copy_backward(P_.begin(), P_.begin() + N_, P_.end());
        std::fill(P_.begin(), P_.begin() + offset_, 0);
        update_all_layers();
      }